

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_function_primitive_adoptDefinitionOf
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_object_tuple_t *objectTuple;
  _Bool _Var1;
  sysbvm_tuple_t *psVar2;
  sysbvm_bitflags_t sVar3;
  sysbvm_bitflags_t sVar4;
  sysbvm_tuple_t sVar5;
  _Bool isCorePrimitive;
  sysbvm_function_t **definitionFunctionObject;
  sysbvm_function_t **functionObject;
  sysbvm_tuple_t *definitionFunction;
  sysbvm_tuple_t *function;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  psVar2 = arguments + 1;
  _Var1 = sysbvm_tuple_isFunction(context,*arguments);
  if (!_Var1) {
    sysbvm_error("Expected a function.");
  }
  _Var1 = sysbvm_tuple_isFunction(context,*psVar2);
  if (!_Var1) {
    sysbvm_error("Expected a function.");
  }
  *(undefined8 *)(*arguments + 0x48) = *(undefined8 *)(*psVar2 + 0x48);
  *(undefined8 *)(*arguments + 0x38) = *(undefined8 *)(*psVar2 + 0x38);
  *(undefined8 *)(*arguments + 0x40) = *(undefined8 *)(*psVar2 + 0x40);
  _Var1 = sysbvm_function_isCorePrimitive(context,*arguments);
  if (_Var1) {
    sVar3 = sysbvm_tuple_bitflags_decode(*(sysbvm_tuple_t *)(*arguments + 0x28));
    sVar4 = sysbvm_tuple_bitflags_decode(*(sysbvm_tuple_t *)(*psVar2 + 0x28));
    sVar5 = sysbvm_tuple_bitflags_encode(sVar3 & 0x8001c | sVar4);
    *(sysbvm_tuple_t *)(*arguments + 0x28) = sVar5;
    if (*(long *)(*psVar2 + 0x58) != 0) {
      *(undefined8 *)(*arguments + 0x58) = *(undefined8 *)(*psVar2 + 0x58);
    }
  }
  else {
    *(undefined8 *)(*arguments + 0x28) = *(undefined8 *)(*psVar2 + 0x28);
    *(undefined8 *)(*arguments + 0x58) = *(undefined8 *)(*psVar2 + 0x58);
    *(undefined8 *)(*arguments + 0x50) = *(undefined8 *)(*psVar2 + 0x50);
    *(undefined8 *)(*arguments + 0x68) = *(undefined8 *)(*psVar2 + 0x68);
  }
  if ((*(long *)(*arguments + 0x18) != 0) || (*(long *)(*arguments + 0x10) != 0)) {
    sysbvm_programEntity_recordBindingWithOwnerAndName
              (context,*(sysbvm_tuple_t *)(*arguments + 0x48),*(sysbvm_tuple_t *)(*arguments + 0x18)
               ,*(sysbvm_tuple_t *)(*arguments + 0x10));
  }
  objectTuple = (sysbvm_object_tuple_t *)*arguments;
  sVar5 = sysbvm_tuple_getType(context,*psVar2);
  sysbvm_tuple_setType(objectTuple,sVar5);
  return 0x2f;
}

Assistant:

static sysbvm_tuple_t sysbvm_function_primitive_adoptDefinitionOf(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *function = &arguments[0];
    sysbvm_tuple_t *definitionFunction = &arguments[1];
    if(!sysbvm_tuple_isFunction(context, *function)) sysbvm_error("Expected a function.");
    if(!sysbvm_tuple_isFunction(context, *definitionFunction)) sysbvm_error("Expected a function.");
    
    sysbvm_function_t **functionObject = (sysbvm_function_t**)function;
    sysbvm_function_t **definitionFunctionObject = (sysbvm_function_t**)definitionFunction;

    (*functionObject)->definition = (*definitionFunctionObject)->definition;
    (*functionObject)->captureVector = (*definitionFunctionObject)->captureVector;
    (*functionObject)->captureEnvironment = (*definitionFunctionObject)->captureEnvironment;
    bool isCorePrimitive = sysbvm_function_isCorePrimitive(context, *function);
    if(isCorePrimitive)
    {
        (*functionObject)->flags = sysbvm_tuple_bitflags_encode(
            (sysbvm_tuple_bitflags_decode((*functionObject)->flags) & SYSBVM_FUNCTION_FLAGS_BOOTSTRAP_PRIMITIVE_KEPT_FLAGS)
            | sysbvm_tuple_bitflags_decode((*definitionFunctionObject)->flags)
        );

        if((*definitionFunctionObject)->primitiveName)
            (*functionObject)->primitiveName = (*definitionFunctionObject)->primitiveName;
    }
    else
    {
        (*functionObject)->flags = (*definitionFunctionObject)->flags;
        (*functionObject)->primitiveName = (*definitionFunctionObject)->primitiveName;
        (*functionObject)->primitiveTableIndex = (*definitionFunctionObject)->primitiveTableIndex;
        (*functionObject)->annotations = (*definitionFunctionObject)->annotations;
    }

    if((*functionObject)->super.owner || (*functionObject)->super.name)
        sysbvm_programEntity_recordBindingWithOwnerAndName(context, (*functionObject)->definition, (*functionObject)->super.owner, (*functionObject)->super.name);
    sysbvm_tuple_setType((sysbvm_object_tuple_t*)*functionObject, sysbvm_tuple_getType(context, (sysbvm_tuple_t)*definitionFunctionObject));
    return SYSBVM_VOID_TUPLE;
}